

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O3

char * replaceChar(char *stri,char ch1,char ch2)

{
  ulong uVar1;
  string seq;
  allocator<char> local_41;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,stri,&local_41);
  if (local_38 != 0) {
    uVar1 = 0;
    do {
      if (*(char *)((long)local_40 + uVar1) == ch1) {
        *(char *)((long)local_40 + uVar1) = ch2;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_38);
  }
  strcpy(stri,(char *)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return stri;
}

Assistant:

char* replaceChar(char *stri, char ch1, char ch2) {
    std::string seq(stri);
    // cout << seq.length() << endl;
    for (int i = 0; i < seq.length(); ++i) {
        if (seq[i] == ch1)
            seq[i] = ch2;
    }
    // char output[seq.length()+1];
    strcpy(stri, seq.c_str());
    return stri;
}